

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>
  *pFVar2;
  FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>_>
  FVar3;
  undefined8 *puVar4;
  double *pdVar5;
  value_type vVar6;
  
  vVar6 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>
          ::dx(&this->left_->fadexpr_,i);
  pFVar1 = this->right_;
  pdVar5 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar5 = (pFVar1->dx_).ptr_to_data + i;
  }
  pFVar2 = (this->left_->fadexpr_).left_;
  FVar3.expr_ = (((pFVar2->fadexpr_).left_)->fadexpr_).expr_;
  puVar4 = *(undefined8 **)&(FVar3.expr_)->fadexpr_;
  return vVar6 * pFVar1->val_ -
         (*(double *)*puVar4 / (double)puVar4[1]) *
         ((FadCst<double> *)((long)&(FVar3.expr_)->fadexpr_ + 8))->constant_ *
         ((pFVar2->fadexpr_).right_)->val_ * ((this->left_->fadexpr_).right_)->val_ * *pdVar5;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}